

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

int get_branchlength(uint32_t **pptrptr,int *errcodeptr,int *lcptr,parsed_recurse_check *recurses,
                    compile_block_16 *cb)

{
  short sVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  BOOL BVar6;
  int iVar7;
  PCRE2_SPTR16 str1;
  uint32_t *puVar8;
  uint32_t length;
  uint32_t meta_code;
  named_group_16 *ng;
  BOOL is_dupname;
  PCRE2_SPTR16 name;
  int i;
  uint32_t itemlength;
  uint32_t group;
  uint32_t escape;
  uint32_t *gptrend;
  uint32_t *gptr;
  parsed_recurse_check *r;
  parsed_recurse_check this_recurse;
  size_t offset;
  uint32_t *pptr;
  int local_40;
  uint32_t lastitemlength;
  int grouplength;
  int branchlength;
  compile_block_16 *cb_local;
  parsed_recurse_check *recurses_local;
  int *lcptr_local;
  int *errcodeptr_local;
  uint32_t **pptrptr_local;
  
  lastitemlength = 0;
  pptr._4_4_ = 0;
  offset = (size_t)*pptrptr;
  iVar7 = *lcptr;
  *lcptr = iVar7 + 1;
  _grouplength = cb;
  cb_local = (compile_block_16 *)recurses;
  recurses_local = (parsed_recurse_check *)lcptr;
  lcptr_local = errcodeptr;
  errcodeptr_local = (int *)pptrptr;
  if (2000 < iVar7) {
    *errcodeptr = 0x87;
    return -1;
  }
  do {
    i = 0;
    name._4_4_ = 0;
    if (*(uint *)offset < 0x80000000) {
      name._4_4_ = 1;
      goto LAB_0014b977;
    }
    sVar1 = *(short *)(offset + 2);
    if (sVar1 == -0x7fff) goto LAB_0014b9bb;
    if (sVar1 == -0x7ffe) {
LAB_0014b8c0:
      offset = offset + 4;
      goto LAB_0014b8cc;
    }
    if (sVar1 == -0x7ffd) {
      if (((_grouplength->external_options & 0x200) != 0) ||
         ((_grouplength->external_flags & 0x200000) != 0)) goto LAB_0014b95f;
      i = *(uint *)offset & 0xffff;
      if ((uint)i < 10) {
        this_recurse.groupptr = (uint32_t *)_grouplength->small_ref_offset[(uint)i];
      }
      else {
LAB_0014b6cf:
        i = *(uint *)offset & 0xffff;
        this_recurse.groupptr =
             (uint32_t *)CONCAT44(*(undefined4 *)(offset + 4),*(undefined4 *)(offset + 8));
        offset = offset + 8;
      }
LAB_0014b702:
      if (_grouplength->bracount < (uint)i) {
        _grouplength->erroroffset = (size_t)this_recurse.groupptr;
        *lcptr_local = 0x73;
        return -1;
      }
      if (i == 0) goto LAB_0014b95f;
      for (gptrend = _grouplength->parsed_pattern; *gptrend != 0x80000000; gptrend = gptrend + 1) {
        if ((*gptrend & 0xffff0000) == 0x80050000) {
          gptrend = gptrend + 1;
        }
        else if (*gptrend == (i | 0x80080000U)) break;
      }
      puVar8 = parsed_skip(gptrend + 1,2);
      if (puVar8 == (uint32_t *)0x0) {
LAB_0014b9ea:
        *lcptr_local = 0xbe;
        return -1;
      }
      if ((gptrend < offset) && (offset < puVar8)) {
LAB_0014b95f:
        *lcptr_local = 0x7d;
        return -1;
      }
      for (gptr = (uint32_t *)cb_local;
          (gptr != (uint32_t *)0x0 && (*(uint32_t **)(gptr + 2) != gptrend));
          gptr = *(uint32_t **)gptr) {
      }
      if (gptr != (uint32_t *)0x0) goto LAB_0014b95f;
      r = (parsed_recurse_check *)cb_local;
      this_recurse.prev = (parsed_recurse_check *)gptrend;
      gptrend = gptrend + 1;
      name._4_4_ = get_grouplength(&gptrend,0,lcptr_local,(int *)recurses_local,i,
                                   (parsed_recurse_check *)&r,_grouplength);
      local_40 = name._4_4_;
      if (name._4_4_ < 0) {
        if (*lcptr_local != 0) {
          return -1;
        }
        goto LAB_0014b95f;
      }
    }
    else {
      if (sVar1 == -0x7ffc) {
        if ((_grouplength->external_options & 0x200) != 0) goto LAB_0014b95f;
LAB_0014b4f6:
        uVar2 = 0;
        _length = _grouplength->named_groups;
        uVar5 = *(uint *)offset;
        uVar4 = *(uint *)(offset + 4);
        this_recurse.groupptr =
             (uint32_t *)CONCAT44(*(undefined4 *)(offset + 8),*(undefined4 *)(offset + 0xc));
        offset = offset + 0xc;
        str1 = _grouplength->start_pattern + (long)this_recurse.groupptr;
        for (name._0_4_ = 0; (int)name < (int)(uint)_grouplength->names_found;
            name._0_4_ = (int)name + 1) {
          if ((uVar4 == _length->length) &&
             (iVar7 = _pcre2_strncmp_16(str1,_length->name,(ulong)uVar4), iVar7 == 0)) {
            i = _length->number;
            uVar2 = _length->isdup;
            break;
          }
          _length = _length + 1;
        }
        if (i == 0) {
          *lcptr_local = 0x73;
          _grouplength->erroroffset = (size_t)this_recurse.groupptr;
          return -1;
        }
        if (((uVar5 & 0xffff0000) != 0x80210000) &&
           ((uVar2 != 0 || ((_grouplength->external_flags & 0x200000) != 0)))) goto LAB_0014b95f;
        goto LAB_0014b702;
      }
      if (sVar1 == -0x7ffb) {
        name._4_4_ = 1;
        offset = offset + 4;
      }
      else if (sVar1 == -0x7ffa) {
        offset = offset + 0xc;
      }
      else if (sVar1 == -0x7ff9) {
        offset = offset + 0x14;
      }
      else {
        if (sVar1 == -0x7ff8) {
          i = *(uint *)offset & 0xffff;
          goto LAB_0014b8c0;
        }
        if (sVar1 != -0x7ff7) {
          if (sVar1 == -0x7ff6) {
LAB_0014b2b7:
            name._4_4_ = 1;
            offset = (size_t)parsed_skip((uint32_t *)offset,1);
            if ((uint32_t *)offset == (uint32_t *)0x0) goto LAB_0014b9ea;
          }
          else if (sVar1 == -0x7ff4) {
LAB_0014b2e4:
            name._4_4_ = 1;
          }
          else {
            if (sVar1 == -0x7ff2) goto LAB_0014b2b7;
            if (sVar1 == -0x7ff1) {
              offset = offset + 4;
            }
            else if ((((sVar1 == -0x7ff0) || (sVar1 == -0x7fef)) || (sVar1 == -0x7fee)) ||
                    ((sVar1 == -0x7fed || (sVar1 == -0x7fec)))) {
              offset = offset + 0x10;
            }
            else {
              if (sVar1 != -0x7feb) {
                if (sVar1 != -0x7fea) {
                  if (sVar1 == -0x7fe9) goto LAB_0014b2e4;
                  if (sVar1 == -0x7fe8) {
                    uVar5 = *(uint *)offset & 0xffff;
                    if ((uVar5 == 0x11) || (uVar5 == 0x16)) {
                      return -1;
                    }
                    if ((5 < uVar5) && (uVar5 < 0x17)) {
                      if (((_grouplength->external_options & 0x80000) != 0) && (uVar5 == 0xe)) {
                        *lcptr_local = 0x88;
                        return -1;
                      }
                      name._4_4_ = 1;
                      if ((uVar5 == 0x10) || (uVar5 == 0xf)) {
                        offset = offset + 4;
                      }
                    }
                  }
                  else {
                    if (sVar1 == -0x7fe7) {
LAB_0014b9bb:
                      *(size_t *)errcodeptr_local = offset;
                      if (_grouplength->max_lookbehind < (int)lastitemlength) {
                        _grouplength->max_lookbehind = lastitemlength;
                      }
                      return lastitemlength;
                    }
                    if (sVar1 == -0x7fe6) goto LAB_0014b8c0;
                    if (sVar1 == -0x7fe5) {
                      offset = offset + 4;
                      goto LAB_0014b977;
                    }
                    if (sVar1 == -0x7fe0) goto LAB_0014b6cf;
                    if (sVar1 == -0x7fdf) goto LAB_0014b4f6;
                    if ((sVar1 == -0x7fde) || (sVar1 == -0x7fdd)) {
                      offset = (size_t)parsed_skip((uint32_t *)(offset + 4),2);
                      if ((uint32_t *)offset == (uint32_t *)0x0) goto LAB_0014b9ea;
                      uVar3 = *(uint32_t *)(offset + 4);
                      if (((((uVar3 == 0x80310000) || (uVar3 == 0x80320000)) ||
                           (uVar3 == 0x80330000)) ||
                          (((uVar3 == 0x80340000 || (uVar3 == 0x80350000)) ||
                           ((uVar3 == 0x80360000 || ((uVar3 == 0x80370000 || (uVar3 == 0x80380000)))
                            ))))) || (uVar3 == 0x80390000)) {
                        offset = offset + 4;
                      }
                      else if (((uVar3 == 0x803a0000) || (uVar3 == 0x803b0000)) ||
                              (uVar3 == 0x803c0000)) {
                        offset = offset + 0xc;
                      }
                    }
                    else if ((sVar1 == -0x7fdc) || (sVar1 == -0x7fdb)) {
                      BVar6 = set_lookbehind_lengths
                                        ((uint32_t **)&offset,lcptr_local,(int *)recurses_local,
                                         (parsed_recurse_check *)cb_local,_grouplength);
                      if (BVar6 == 0) {
                        return -1;
                      }
                    }
                    else {
                      if (sVar1 == -0x7fda) goto LAB_0014b266;
                      if ((sVar1 == -0x7fd9) || (sVar1 == -0x7fd8)) {
                        offset = (size_t)parsed_skip((uint32_t *)offset,0);
                        if ((uint32_t *)offset != (uint32_t *)0x0) goto LAB_0014b9bb;
                        goto LAB_0014b9ea;
                      }
                      if (sVar1 != -0x7fd7) {
                        if (sVar1 == -0x7fd6) {
LAB_0014b266:
                          offset = offset + (ulong)(*(int *)(offset + 4) + 1) * 4;
                        }
                        else if (sVar1 != -0x7fd5) {
                          if (sVar1 == -0x7fd4) goto LAB_0014b266;
                          if (sVar1 != -0x7fd3) {
                            if (sVar1 == -0x7fd2) goto LAB_0014b266;
                            if (sVar1 != -0x7fd1) {
                              if (sVar1 == -0x7fd0) goto LAB_0014b266;
                              if ((((sVar1 != -0x7fc6) && (sVar1 != -0x7fc5)) && (sVar1 != -0x7fc4))
                                 || (*(int *)(offset + 4) != *(int *)(offset + 8)))
                              goto LAB_0014b95f;
                              if (*(int *)(offset + 4) == 0) {
                                lastitemlength = lastitemlength - pptr._4_4_;
                              }
                              else {
                                name._4_4_ = (*(int *)(offset + 4) + -1) * pptr._4_4_;
                              }
                              offset = offset + 8;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0014b977;
              }
              offset = offset + 0x10;
            }
LAB_0014b8cc:
            name._4_4_ = get_grouplength((uint32_t **)&offset,1,lcptr_local,(int *)recurses_local,i,
                                         (parsed_recurse_check *)cb_local,_grouplength);
            local_40 = name._4_4_;
            if (name._4_4_ < 0) {
              return -1;
            }
          }
        }
      }
    }
LAB_0014b977:
    lastitemlength = name._4_4_ + lastitemlength;
    pptr._4_4_ = name._4_4_;
    if (0xffff < (int)lastitemlength) {
      *lcptr_local = 0xbb;
      return -1;
    }
    offset = offset + 4;
  } while( true );
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int grouplength;
uint32_t lastitemlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;

  if (*pptr < META_END)
    {
    itemlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 1;
    break;

    case META_BIGVALUE:
    itemlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R and \X are never
    allowed because they might match more than character. \C is allowed only in
    32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_R || escape == ESC_X) return -1;
    if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads can be ignored, but we must start the skip inside the group
    so that it isn't treated as a group within the branch. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;

    /* Also ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* Lookbehinds can be ignored, but must themselves be checked. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, FALSE, errcodeptr, lcptr, group,
      &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    break;

    /* Check nested groups - advance past the initial data for each type and
    then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_DEFINE:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, TRUE, errcodeptr, lcptr, group,
      recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    break;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    if (pptr[1] == pptr[2])
      {
      if (pptr[1] == 0) branchlength -= lastitemlength;
        else itemlength = (pptr[1] - 1) * lastitemlength;
      pptr += 2;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, and save it for use if the next
  thing is a quantifier. */

  branchlength += itemlength;
  lastitemlength = itemlength;

  /* Ensure that the length does not overflow the limit. */

  if (branchlength > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }
  }

EXIT:
*pptrptr = pptr;
if (branchlength > cb->max_lookbehind) cb->max_lookbehind = branchlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}